

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O2

void __thiscall imrt::Plan::~Plan(Plan *this)

{
  ~Plan(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Plan() {}